

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

string * __thiscall
kratos::EventControl::to_string
          (string *__return_storage_ptr__,EventControl *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
          *var_str)

{
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  char *pcVar1;
  basic_string_view<char> bVar2;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (this->type == Edge) {
    pcVar1 = "negedge";
    if (this->edge == Posedge) {
      pcVar1 = "posedge";
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
    ::operator()(&local_68,var_str,this->var);
    local_48.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    local_48.field_2._8_8_ = local_68._M_string_length;
    local_48._M_dataplus._M_p = pcVar1;
    bVar2 = fmt::v7::to_string_view<char,_0>("{0} {1}");
    format_str_00.data_ = (char *)bVar2.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    format_str_00.size_ = 0xdc;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)bVar2.data_,format_str_00,args_00);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    if (this->type != Delay) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Unrecognized event control type",(allocator<char> *)&local_68)
      ;
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)this->delay;
    bVar2 = fmt::v7::to_string_view<char,_0>("#{0}");
    format_str.data_ = (char *)bVar2.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    format_str.size_ = 4;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)bVar2.data_,format_str,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EventControl::to_string(const std::function<std::string(const Var *)> &var_str) const {
    switch (type) {
        case EventControlType::Delay: {
            return ::format("#{0}", delay);
        }
        case EventControlType::Edge: {
            return ::format("{0} {1}", edge == EventEdgeType::Posedge ? "posedge" : "negedge",
                            var_str(var));
        }
    }
    throw InternalException("Unrecognized event control type");
}